

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O3

void __thiscall
SubCircuit<0>::explainAcantreachB
          (SubCircuit<0> *this,Clause *reason,int reasonIndex,vec<int> *A,vec<int> *B,int a1,int b1)

{
  IntVar *pIVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar3 = A->sz;
  if (uVar3 != 0) {
    uVar2 = B->sz;
    uVar7 = 0;
    uVar5 = uVar2;
    do {
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar6 = 0;
        do {
          if ((A->data[uVar7] != a1) || (B->data[uVar6] != b1)) {
            pIVar1 = this->x[A->data[uVar7]].var;
            uVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])
                              (pIVar1,(long)B->data[uVar6],0);
            if ((int)(*(uint *)reason >> 8) <= reasonIndex) {
              abort();
            }
            lVar4 = (long)reasonIndex;
            reasonIndex = reasonIndex + 1;
            reason->data[lVar4].x = uVar3 ^ 1;
            uVar2 = B->sz;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < uVar2);
        uVar3 = A->sz;
        uVar5 = uVar2;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar3);
  }
  return;
}

Assistant:

void explainAcantreachB(Clause* reason, int reasonIndex, vec<int> A, vec<int> B, int a1 = -1,
													int b1 = -1) {
		// fprintf(stderr, "explaining");
		for (unsigned int a = 0; a < A.size(); a++) {
			assert(A[a] < size && A[a] >= 0);
			for (unsigned int b = 0; b < B.size(); b++) {
				assert(B[b] < size && B[b] >= 0);
				if (A[a] != a1 || B[b] != b1) {
					assert(!x[A[a]].indomain(B[b]));
					// fprintf(stderr, "add %d not equal to %d\n", A[a], B[b]);
					(*reason)[reasonIndex++] = ~x[A[a]].getLit(B[b], LR_NE);
				}
			}
		}
		// fprintf(stderr, "done\n");
	}